

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O2

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::updateFilteredNormals
          (FastAndEffectiveFeaturePreservingMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ParameterSet *pPVar6;
  pointer pVVar7;
  bool bVar8;
  size_type __new_size;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  FaceIter FVar13;
  undefined1 local_f0 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  double threshold_T;
  VectorT<double,_3> local_b8;
  undefined1 local_98 [8];
  FaceIter f_it;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  int local_64;
  int local_60;
  int face_neighbor_index;
  int normal_iteration_number;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  
  pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string
            ((string *)&normal_iteration_number,"Face Neighbor",(allocator *)&f_it.hnd_);
  bVar8 = ParameterSet::getValue(pPVar6,(string *)&normal_iteration_number,&local_64);
  std::__cxx11::string::~string((string *)&normal_iteration_number);
  if (bVar8) {
    pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string
              ((string *)&normal_iteration_number,"Threshold T",(allocator *)&f_it.hnd_);
    bVar8 = ParameterSet::getValue
                      (pPVar6,(string *)&normal_iteration_number,
                       (double *)
                       &face_neighbor.
                        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&normal_iteration_number);
    if (bVar8) {
      pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
      std::__cxx11::string::string
                ((string *)&normal_iteration_number,"Normal Iteration Num.",(allocator *)&f_it.hnd_)
      ;
      bVar8 = ParameterSet::getValue(pPVar6,(string *)&normal_iteration_number,&local_60);
      std::__cxx11::string::~string((string *)&normal_iteration_number);
      if (bVar8) {
        _normal_iteration_number = (pointer)0x0;
        all_face_neighbor.
        super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        all_face_neighbor.
        super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getAllFaceNeighbor
                  (&this->super_MeshDenoisingBase,mesh,
                   (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    *)&normal_iteration_number,(uint)(local_64 != 0),true);
        __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                            .
                                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                 + 0x28))(mesh);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        resize(filtered_normals,__new_size);
        f_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
        f_it.skip_bits_ = 0;
        MeshDenoisingBase::getFaceNormal
                  (&this->super_MeshDenoisingBase,mesh,
                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)&f_it.hnd_);
        for (face_neighbor_index = 0; face_neighbor_index < local_60;
            face_neighbor_index = face_neighbor_index + 1) {
          _local_98 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
          while( true ) {
            FVar13 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
            if (f_it.mesh_._0_4_ == (BaseHandle)FVar13.hnd_.super_BaseHandle.idx_ &&
                local_98 == (undefined1  [8])FVar13.mesh_) break;
            lVar11 = (long)(int)f_it.mesh_._0_4_ * 0x18;
            dVar1 = *(double *)(f_it._8_8_ + lVar11);
            dVar2 = *(double *)(f_it._8_8_ + 8 + lVar11);
            dVar3 = *(double *)(f_it._8_8_ + 0x10 + lVar11);
            std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                      ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                       local_f0,(vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                 *)(_normal_iteration_number + lVar11));
            local_b8.super_VectorDataT<double,_3>.values_[0] = 0.0;
            local_b8.super_VectorDataT<double,_3>.values_[1] = 0.0;
            local_b8.super_VectorDataT<double,_3>.values_[2] = 0.0;
            uVar9 = (ulong)((long)face_neighbor.
                                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)local_f0) >> 2;
            uVar10 = uVar9 & 0xffffffff;
            if ((int)uVar9 < 1) {
              uVar10 = 0;
            }
            for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
              lVar11 = (long)(((pointer)((long)local_f0 + uVar9 * 4))->super_BaseHandle).idx_ * 0x18
              ;
              dVar4 = *(double *)(f_it._8_8_ + 8 + lVar11);
              dVar5 = *(double *)(f_it._8_8_ + 0x10 + lVar11);
              dVar12 = (dVar3 * dVar5 +
                       dVar2 * dVar4 + dVar1 * *(double *)(f_it._8_8_ + lVar11) + 0.0) -
                       (double)face_neighbor.
                               super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
              dVar12 = (double)((ulong)(dVar12 * dVar12) & -(ulong)(0.0 < dVar12));
              local_b8.super_VectorDataT<double,_3>.values_[0] =
                   local_b8.super_VectorDataT<double,_3>.values_[0] +
                   *(double *)(f_it._8_8_ + lVar11) * dVar12;
              local_b8.super_VectorDataT<double,_3>.values_[1] =
                   local_b8.super_VectorDataT<double,_3>.values_[1] + dVar4 * dVar12;
              local_b8.super_VectorDataT<double,_3>.values_[2] =
                   local_b8.super_VectorDataT<double,_3>.values_[2] + dVar12 * dVar5;
            }
            OpenMesh::VectorT<double,_3>::normalize(&local_b8);
            pVVar7 = (filtered_normals->
                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pVVar7[(int)f_it.mesh_._0_4_].super_VectorDataT<double,_3>.values_[2] =
                 local_b8.super_VectorDataT<double,_3>.values_[2];
            pVVar7 = pVVar7 + (int)f_it.mesh_._0_4_;
            (pVVar7->super_VectorDataT<double,_3>).values_[0] =
                 local_b8.super_VectorDataT<double,_3>.values_[0];
            (pVVar7->super_VectorDataT<double,_3>).values_[1] =
                 local_b8.super_VectorDataT<double,_3>.values_[1];
            std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
            ~_Vector_base((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                           *)local_f0);
            OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_98,0);
          }
          std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::operator=((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)&f_it.hnd_,filtered_normals);
        }
        std::
        _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        ~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)&f_it.hnd_);
        std::
        vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                   *)&normal_iteration_number);
      }
    }
  }
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::updateFilteredNormals(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    // get parameter for normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    double threshold_T;
    if(!parameter_set_->getValue(string("Threshold T"), threshold_T))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("Normal Iteration Num."), normal_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = (face_neighbor_index == 0) ? kVertexBased : kEdgeBased;

    std::vector< std::vector<TriMesh::FaceHandle> > all_face_neighbor;
    getAllFaceNeighbor(mesh, all_face_neighbor, face_neighbor_type, true);

    filtered_normals.resize(mesh.n_faces());

    std::vector<TriMesh::Normal> previous_normals;
    getFaceNormal(mesh, previous_normals);

    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            TriMesh::Normal ni = previous_normals[f_it->idx()];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[f_it->idx()];
            TriMesh::Normal temp_normal(0.0, 0.0, 0.0);
            for(int i = 0; i <(int)face_neighbor.size(); i++)
            {
                TriMesh::Normal nj = previous_normals[face_neighbor[i].idx()];
                double value = (ni | nj) - threshold_T;
                double weight = (value > 0) ? value * value : 0;
                temp_normal += nj * weight;
            }
            temp_normal.normalize();
            filtered_normals[f_it->idx()] = temp_normal;
        }
        previous_normals = filtered_normals;
    }
}